

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor.cpp
# Opt level: O1

bool duckdb::ExpressionExecutor::TryEvaluateScalar
               (ClientContext *context,Expression *expr,Value *result)

{
  Value local_50;
  
  EvaluateScalar(&local_50,context,expr,false);
  Value::operator=(result,&local_50);
  Value::~Value(&local_50);
  return true;
}

Assistant:

bool ExpressionExecutor::TryEvaluateScalar(ClientContext &context, const Expression &expr, Value &result) {
	try {
		result = EvaluateScalar(context, expr);
		return true;
	} catch (InternalException &ex) {
		throw;
	} catch (...) {
		return false;
	}
}